

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::root_directory(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  int iVar2;
  string_type local_28;
  
  bVar1 = has_root_directory(this);
  if (bVar1) {
    if (root_directory()::_root_dir == '\0') {
      iVar2 = __cxa_guard_acquire(&root_directory()::_root_dir);
      if (iVar2 != 0) {
        local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_28,'\x01');
        path(&root_directory::_root_dir,&local_28,native_format);
        std::__cxx11::string::~string((string *)&local_28);
        __cxa_atexit(~path,&root_directory::_root_dir,&__dso_handle);
        __cxa_guard_release(&root_directory()::_root_dir);
      }
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&root_directory::_root_dir);
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_directory() const
{
    if (has_root_directory()) {
        static const path _root_dir(std::string(1, preferred_separator), native_format);
        return _root_dir;
    }
    return path();
}